

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec3,int *idx3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int *rn3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  undefined8 *puVar1;
  uint *puVar2;
  int iVar3;
  fpclass_type fVar4;
  int *heap;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int local_4e8;
  undefined1 local_4e1;
  int *local_4e0;
  int *local_4d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d0;
  int32_t local_4c4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c0;
  int *local_4b8;
  int *local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_468;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_a8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_a8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
  local_e8.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
  local_e8.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
  local_e8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
  local_4e0 = ridx;
  local_4c0 = vec;
  local_4b8 = idx;
  vSolveLright3(this,rhs,ridx,rn,&local_68,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._24_8_,(int *)eps2.m_backend.data._M_elems._32_8_,
                (int *)eps2.m_backend._40_8_,&local_a8,rhs2,ridx2,rn2,&local_e8);
  local_4d8 = (this->row).perm;
  local_4e8 = 0;
  local_4d0 = eps;
  local_4a8 = rhs;
  local_4a0 = this;
  if (eps3.m_backend.data._M_elems._0_8_ == 0) {
    for (lVar8 = 0; heap = local_4e0, lVar8 < *rn; lVar8 = lVar8 + 1) {
      iVar7 = local_4e0[lVar8];
      local_478 = *(undefined8 *)(rhs[iVar7].m_backend.data._M_elems + 8);
      local_498 = *(undefined8 *)rhs[iVar7].m_backend.data._M_elems;
      uStack_490 = *(undefined8 *)(rhs[iVar7].m_backend.data._M_elems + 2);
      puVar2 = rhs[iVar7].m_backend.data._M_elems + 4;
      local_488 = *(undefined8 *)puVar2;
      uStack_480 = *(undefined8 *)(puVar2 + 2);
      local_2e8.m_backend.exp = rhs[iVar7].m_backend.exp;
      local_2e8.m_backend.neg = rhs[iVar7].m_backend.neg;
      local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar7].m_backend.data._M_elems;
      local_2e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar7].m_backend.data._M_elems + 2);
      puVar2 = rhs[iVar7].m_backend.data._M_elems + 4;
      local_2e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_2e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_2e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(rhs[iVar7].m_backend.data._M_elems + 8);
      local_2e8.m_backend.fpclass = rhs[iVar7].m_backend.fpclass;
      local_2e8.m_backend.prec_elem = rhs[iVar7].m_backend.prec_elem;
      local_328.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_4d0->m_backend).data._M_elems;
      local_328.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_4d0->m_backend).data._M_elems + 2);
      local_328.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_4d0->m_backend).data._M_elems + 4);
      local_328.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_4d0->m_backend).data._M_elems + 6);
      local_328.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_4d0->m_backend).data._M_elems + 8);
      local_328.m_backend.exp = (local_4d0->m_backend).exp;
      local_328.m_backend.neg = (local_4d0->m_backend).neg;
      local_328.m_backend.fpclass = (local_4d0->m_backend).fpclass;
      local_328.m_backend.prec_elem = (local_4d0->m_backend).prec_elem;
      bVar6 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2e8,&local_328);
      if (bVar6) {
        enQueueMax(heap,&local_4e8,local_4d8[iVar7]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs[iVar7].m_backend,0);
      }
    }
    *rn = local_4e8;
  }
  else {
    local_4b0 = (int *)eps3.m_backend.data._M_elems._16_8_;
    for (lVar8 = 0; lVar8 < *rn; lVar8 = lVar8 + 1) {
      iVar7 = local_4e0[lVar8];
      lVar10 = (long)iVar7;
      lVar9 = lVar10 * 0x38;
      local_478 = *(undefined8 *)(rhs[lVar10].m_backend.data._M_elems + 8);
      local_498 = *(undefined8 *)rhs[lVar10].m_backend.data._M_elems;
      uStack_490 = *(undefined8 *)(rhs[lVar10].m_backend.data._M_elems + 2);
      puVar2 = rhs[lVar10].m_backend.data._M_elems + 4;
      local_488 = *(undefined8 *)puVar2;
      uStack_480 = *(undefined8 *)(puVar2 + 2);
      iVar3 = rhs[lVar10].m_backend.exp;
      local_4e1 = rhs[lVar10].m_backend.neg;
      fVar4 = rhs[lVar10].m_backend.fpclass;
      local_4c4 = rhs[lVar10].m_backend.prec_elem;
      local_468.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(rhs[lVar10].m_backend.data._M_elems + 8);
      local_468.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar10].m_backend.data._M_elems;
      local_468.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[lVar10].m_backend.data._M_elems + 2);
      puVar2 = rhs[lVar10].m_backend.data._M_elems + 4;
      local_468.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_468.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_4d0->m_backend).data._M_elems;
      local_2a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_4d0->m_backend).data._M_elems + 2);
      local_2a8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_4d0->m_backend).data._M_elems + 4);
      local_2a8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_4d0->m_backend).data._M_elems + 6);
      local_2a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_4d0->m_backend).data._M_elems + 8);
      local_2a8.m_backend.exp = (local_4d0->m_backend).exp;
      local_2a8.m_backend.neg = (local_4d0->m_backend).neg;
      local_2a8.m_backend.fpclass = (local_4d0->m_backend).fpclass;
      local_2a8.m_backend.prec_elem = (local_4d0->m_backend).prec_elem;
      local_468.m_backend.exp = iVar3;
      local_468.m_backend.neg = (bool)local_4e1;
      local_468.m_backend.fpclass = fVar4;
      local_468.m_backend.prec_elem = local_4c4;
      bVar6 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_468,&local_2a8);
      if (bVar6) {
        *local_4b0 = iVar7;
        local_4b0 = local_4b0 + 1;
        enQueueMax(local_4e0,&local_4e8,local_4d8[lVar10]);
        *(undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + 0x20 + lVar9) = local_478;
        puVar1 = (undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + 0x10 + lVar9);
        *puVar1 = local_488;
        puVar1[1] = uStack_480;
        *(undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + lVar9) = local_498;
        ((undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + lVar9))[1] = uStack_490;
        *(int *)(eps3.m_backend.data._M_elems._0_8_ + 0x28 + lVar9) = iVar3;
        *(undefined1 *)(eps3.m_backend.data._M_elems._0_8_ + 0x2c + lVar9) = local_4e1;
        *(fpclass_type *)(eps3.m_backend.data._M_elems._0_8_ + 0x30 + lVar9) = fVar4;
        *(int32_t *)(eps3.m_backend.data._M_elems._0_8_ + 0x34 + lVar9) = local_4c4;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs[lVar10].m_backend,0);
      }
    }
    *rn = local_4e8;
    *(int *)eps3.m_backend.data._M_elems._8_8_ = local_4e8;
  }
  local_4e8 = 0;
  lVar8 = 0;
  while( true ) {
    if (*(int *)eps2.m_backend._40_8_ <= lVar8) break;
    lVar10 = (long)*(int *)(eps2.m_backend.data._M_elems._32_8_ + lVar8 * 4);
    lVar9 = lVar10 * 0x38;
    local_368.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._24_8_ + 0x28 + lVar9);
    local_368.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._24_8_ + 0x2c + lVar9);
    local_368.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x20 + lVar9);
    local_368.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar9);
    local_368.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._24_8_ + lVar9) + 2);
    puVar2 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x10 + lVar9);
    local_368.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_368.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_368.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x30 + lVar9)
    ;
    local_3a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
    local_3a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
    local_3a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
    local_3a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
    local_3a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
    local_3a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
    local_3a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
    local_3a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
    bVar6 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_368,&local_3a8);
    if (bVar6) {
      enQueueMax((int *)eps2.m_backend.data._M_elems._32_8_,&local_4e8,local_4d8[lVar10]);
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)(lVar9 + eps2.m_backend.data._M_elems._24_8_),0);
    }
    lVar8 = lVar8 + 1;
  }
  *(int *)eps2.m_backend._40_8_ = local_4e8;
  local_4e8 = 0;
  for (lVar8 = 0; this_00 = local_4a0, pnVar5 = local_4d0, lVar8 < *rn2; lVar8 = lVar8 + 1) {
    iVar7 = ridx2[lVar8];
    local_3e8.m_backend.exp = rhs2[iVar7].m_backend.exp;
    local_3e8.m_backend.neg = rhs2[iVar7].m_backend.neg;
    local_3e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(rhs2[iVar7].m_backend.data._M_elems + 8);
    local_3e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs2[iVar7].m_backend.data._M_elems;
    local_3e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(rhs2[iVar7].m_backend.data._M_elems + 2);
    puVar2 = rhs2[iVar7].m_backend.data._M_elems + 4;
    local_3e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_3e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_3e8.m_backend.fpclass = rhs2[iVar7].m_backend.fpclass;
    local_3e8.m_backend.prec_elem = rhs2[iVar7].m_backend.prec_elem;
    local_428.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
    local_428.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
    local_428.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
    local_428.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
    local_428.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
    local_428.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
    local_428.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
    local_428.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
    bVar6 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_3e8,&local_428);
    if (bVar6) {
      enQueueMax(ridx2,&local_4e8,local_4d8[iVar7]);
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&rhs2[iVar7].m_backend,0);
    }
  }
  *rn2 = local_4e8;
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_4d0->m_backend).data._M_elems + 8);
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_4d0->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((local_4d0->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_4d0->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_4d0->m_backend).data._M_elems + 6);
  local_128.m_backend.exp = (local_4d0->m_backend).exp;
  local_128.m_backend.neg = (local_4d0->m_backend).neg;
  local_128.m_backend.fpclass = (local_4d0->m_backend).fpclass;
  local_128.m_backend.prec_elem = (local_4d0->m_backend).prec_elem;
  iVar7 = vSolveUright(local_4a0,local_4c0,local_4b8,local_4a8,local_4e0,*rn,&local_128);
  *rn = iVar7;
  local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_168.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_168.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_168.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_168.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_168.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_168.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  iVar7 = vSolveUright(this_00,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)eps2.m_backend.data._M_elems._8_8_,
                       (int *)eps2.m_backend.data._M_elems._16_8_,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)eps2.m_backend.data._M_elems._24_8_,
                       (int *)eps2.m_backend.data._M_elems._32_8_,*(int *)eps2.m_backend._40_8_,
                       &local_168);
  *(int *)eps2.m_backend._40_8_ = iVar7;
  local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
  local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
  local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
  local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
  local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
  local_1a8.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
  local_1a8.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
  local_1a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
  iVar7 = vSolveUright(this_00,vec2,idx2,rhs2,ridx2,*rn2,&local_1a8);
  *rn2 = iVar7;
  if ((this_00->l).updateType == 0) {
    local_1e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar5->m_backend).data._M_elems + 8);
    local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar5->m_backend).data._M_elems;
    local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar5->m_backend).data._M_elems + 2)
    ;
    local_1e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar5->m_backend).data._M_elems + 4);
    local_1e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar5->m_backend).data._M_elems + 6);
    local_1e8.m_backend.exp = (pnVar5->m_backend).exp;
    local_1e8.m_backend.neg = (pnVar5->m_backend).neg;
    local_1e8.m_backend.fpclass = (pnVar5->m_backend).fpclass;
    local_1e8.m_backend.prec_elem = (pnVar5->m_backend).prec_elem;
    iVar7 = vSolveUpdateRight(this_00,local_4c0,local_4b8,*rn,&local_1e8);
    *rn = iVar7;
    local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
    local_228.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
    local_228.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
    local_228.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
    local_228.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
    local_228.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
    local_228.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
    local_228.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
    iVar7 = vSolveUpdateRight(this_00,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)eps2.m_backend.data._M_elems._8_8_,
                              (int *)eps2.m_backend.data._M_elems._16_8_,
                              *(int *)eps2.m_backend._40_8_,&local_228);
    *(int *)eps2.m_backend._40_8_ = iVar7;
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
    local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
    local_268.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
    local_268.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
    local_268.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
    iVar7 = vSolveUpdateRight(this_00,vec2,idx2,*rn2,&local_268);
    *rn2 = iVar7;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}